

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<std::pair<const_int,_unsigned_long>_> * __thiscall
rangeless::fn::impl::to_seq::
gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
::operator()(maybe<std::pair<const_int,_unsigned_long>_> *__return_storage_ptr__,
            gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
            *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_int,_unsigned_long> val;
  _Self local_30;
  _Self local_28;
  _Base_ptr local_20;
  gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  *local_18;
  gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  *this_local;
  
  local_18 = this;
  this_local = (gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
                *)__return_storage_ptr__;
  if ((this->started & 1U) == 0) {
    this->started = true;
    local_20 = (_Base_ptr)
               std::
               map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::begin(&this->inps);
    (this->it)._M_node = local_20;
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         ::end(&this->inps);
    bVar1 = std::operator==(&this->it,&local_28);
    if (!bVar1) {
      std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator++(&this->it);
    }
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::end(&this->inps);
  bVar1 = std::operator==(&this->it,&local_30);
  if (bVar1) {
    maybe<std::pair<const_int,_unsigned_long>_>::maybe(__return_storage_ptr__);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator*(&this->it);
    val._0_8_ = *(ulong *)ppVar2 & 0xffffffff;
    val.second = ppVar2->second;
    maybe<std::pair<const_int,_unsigned_long>_>::maybe(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    started = true;
                    it = inps.begin(); 
                        // r might not be a container (i.e. some input-range
                        // and begin()  may be non-const, so deferring until
                        // the first call to operator() rather than
                        // initializing it{ r.begin() } in constructor.
                } else if(it == inps.end()) {
                    ; // may be equal to end in case of repeated calls to operator() after ended
                } else {
                    ++it;
                }

                if(it == inps.end()) {
                    return { };
                } else {
                    return { std::move(*it) };
                }
            }